

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O3

Value __thiscall
MiniScript::Parser::ParseUnaryMinus(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  long *plVar1;
  bool *pbVar2;
  int iVar3;
  ParseState *this_00;
  undefined4 uVar4;
  StringStorage *pSVar5;
  undefined7 in_register_00000011;
  Lexer *this_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  anon_union_8_3_2f476f46_for_data extraout_RDX_00;
  anon_union_8_3_2f476f46_for_data aVar6;
  anon_union_8_3_2f476f46_for_data extraout_RDX_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX_02;
  anon_union_8_3_2f476f46_for_data extraout_RDX_03;
  anon_union_8_3_2f476f46_for_data extraout_RDX_04;
  anon_union_8_3_2f476f46_for_data extraout_RDX_05;
  anon_union_8_3_2f476f46_for_data extraout_RDX_06;
  anon_union_8_3_2f476f46_for_data extraout_RDX_07;
  anon_union_8_3_2f476f46_for_data extraout_RDX_08;
  anon_union_8_3_2f476f46_for_data extraout_RDX_09;
  anon_union_8_3_2f476f46_for_data extraout_RDX_10;
  Value VVar7;
  Value local_120;
  Value local_110;
  Value local_100;
  Lexer local_f0;
  Lexer local_e8;
  Lexer local_e0;
  undefined1 local_d8 [16];
  bool local_c8;
  StringStorage *local_b8;
  TACLine local_b0;
  Token local_50;
  
  this_01 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  local_b8 = (StringStorage *)tokens;
  Lexer::Peek((Token *)local_d8,this_01);
  uVar4 = local_d8._0_4_;
  if (((StringStorage *)local_d8._8_8_ != (StringStorage *)0x0) && (local_c8 == false)) {
    plVar1 = &((RefCountedStorage *)local_d8._8_8_)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*((RefCountedStorage *)local_d8._8_8_)->_vptr_RefCountedStorage[1])();
    }
  }
  if (uVar4 == OpMinus) {
    Lexer::Dequeue(&local_50,this_01);
    if ((local_50.text.ss != (StringStorage *)0x0) && (local_50.text.isTemp == false)) {
      plVar1 = &((local_50.text.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_50.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_50.text.ss = (StringStorage *)0x0;
    }
    local_e8.ls = this_01->ls;
    if (local_e8.ls != (LexerStorage *)0x0) {
      (local_e8.ls)->refCount = (local_e8.ls)->refCount + 1;
    }
    AllowLineBreak(&local_e8);
    Lexer::release(&local_e8);
    pSVar5 = local_b8;
    local_f0.ls = this_01->ls;
    if (local_f0.ls != (LexerStorage *)0x0) {
      (local_f0.ls)->refCount = (local_f0.ls)->refCount + 1;
    }
    ParseNew((Parser *)local_d8,(Lexer *)local_b8,SUB81(&local_f0,0),false);
    Lexer::release(&local_f0);
    uVar4 = local_d8._0_4_;
    if (local_d8[0] == Number) {
      *(undefined1 *)&(this->errorContext).ss = 1;
      *(undefined1 *)((long)&(this->errorContext).ss + 1) = local_d8[1];
      *(undefined1 *)((long)&(this->errorContext).ss + 2) = local_d8[2];
      *(ulong *)&(this->errorContext).isTemp = local_d8._8_8_ ^ 0x8000000000000000;
      aVar6 = extraout_RDX;
    }
    else {
      this_00 = (ParseState *)pSVar5[1].super_RefCountedStorage._vptr_RefCountedStorage;
      iVar3 = this_00->nextTempNum;
      this_00->nextTempNum = iVar3 + 1;
      local_100.type = Temp;
      local_100.noInvoke = false;
      local_100.localOnly = Off;
      local_100.data.tempNum = iVar3;
      local_110.type = Value::zero;
      local_110.noInvoke = DAT_001c12e1;
      local_110.localOnly = DAT_001c12e2;
      local_110.data.ref = DAT_001c12e8;
      if (DAT_001c12e8 != (RefCountedStorage *)0x0 && Temp < Value::zero) {
        DAT_001c12e8->refCount = DAT_001c12e8->refCount + 1;
      }
      local_120.type = local_d8[0];
      local_120.noInvoke = (bool)local_d8[1];
      local_120.localOnly = local_d8[2];
      local_120.data.ref = (RefCountedStorage *)local_d8._8_8_;
      if ((StringStorage *)local_d8._8_8_ != (StringStorage *)0x0 && Temp < local_d8[0]) {
        plVar1 = &((RefCountedStorage *)local_d8._8_8_)->refCount;
        *plVar1 = *plVar1 + 1;
      }
      local_d8._0_4_ = uVar4;
      TACLine::TACLine(&local_b0,&local_100,AMinusB,&local_110,&local_120);
      ParseState::Add(this_00,&local_b0);
      aVar6 = extraout_RDX_01;
      if ((local_b0.location.context.ss != (StringStorage *)0x0) &&
         (local_b0.location.context.isTemp == false)) {
        plVar1 = &((local_b0.location.context.ss)->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_b0.location.context.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          aVar6 = extraout_RDX_02;
        }
        local_b0.location.context.ss = (StringStorage *)0x0;
      }
      if ((local_b0.comment.ss != (StringStorage *)0x0) && (local_b0.comment.isTemp == false)) {
        plVar1 = &((local_b0.comment.ss)->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_b0.comment.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          aVar6 = extraout_RDX_03;
        }
        local_b0.comment.ss = (StringStorage *)0x0;
      }
      if ((2 < local_b0.rhsB.type) &&
         ((ListStorage<MiniScript::JumpPoint> *)local_b0.rhsB.data.ref !=
          (ListStorage<MiniScript::JumpPoint> *)0x0)) {
        plVar1 = &(local_b0.rhsB.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((RefCountedStorage *)&(local_b0.rhsB.data.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
          aVar6 = extraout_RDX_04;
        }
        local_b0.rhsB.data.number = 0.0;
      }
      if ((2 < local_b0.rhsA.type) &&
         ((ListStorage<MiniScript::BackPatch> *)local_b0.rhsA.data.ref !=
          (ListStorage<MiniScript::BackPatch> *)0x0)) {
        plVar1 = &(local_b0.rhsA.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((RefCountedStorage *)&(local_b0.rhsA.data.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
          aVar6 = extraout_RDX_05;
        }
        local_b0.rhsA.data.number = 0.0;
      }
      if ((2 < local_b0.lhs.type) && ((ParseState *)local_b0.lhs.data.ref != (ParseState *)0x0)) {
        pbVar2 = (bool *)&(local_b0.lhs.data.ref)->refCount;
        *(long *)pbVar2 = *(long *)pbVar2 + -1;
        if (*(long *)pbVar2 == 0) {
          (*(code *)(((List<MiniScript::TACLine> *)&(local_b0.lhs.data.ref)->_vptr_RefCountedStorage
                     )->ls->super_RefCountedStorage).refCount)();
          aVar6 = extraout_RDX_06;
        }
        local_b0.lhs.data.number = 0.0;
      }
      if ((Temp < local_120.type) && ((StringStorage *)local_120.data.ref != (StringStorage *)0x0))
      {
        plVar1 = &(local_120.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((RefCountedStorage *)&(local_120.data.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
          aVar6 = extraout_RDX_07;
        }
        local_120.data.number = 0.0;
      }
      if ((Temp < local_110.type) && (local_110.data.ref != (RefCountedStorage *)0x0)) {
        plVar1 = &(local_110.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(local_110.data.ref)->_vptr_RefCountedStorage[1])();
          aVar6 = extraout_RDX_08;
        }
        local_110.data.number = 0.0;
      }
      if ((Temp < local_100.type) && (local_100.data.ref != (RefCountedStorage *)0x0)) {
        plVar1 = &(local_100.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(local_100.data.ref)->_vptr_RefCountedStorage[1])();
          aVar6 = extraout_RDX_09;
        }
        local_100.data.number = 0.0;
      }
      *(undefined2 *)&(this->errorContext).ss = 2;
      *(undefined1 *)((long)&(this->errorContext).ss + 2) = 0;
      *(int *)&(this->errorContext).isTemp = iVar3;
      if ((Number < local_d8[0]) && ((StringStorage *)local_d8._8_8_ != (StringStorage *)0x0)) {
        plVar1 = &((RefCountedStorage *)local_d8._8_8_)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((RefCountedStorage *)local_d8._8_8_)->_vptr_RefCountedStorage[1])();
          aVar6 = extraout_RDX_10;
        }
      }
    }
  }
  else {
    local_e0.ls = this_01->ls;
    if (local_e0.ls != (LexerStorage *)0x0) {
      (local_e0.ls)->refCount = (local_e0.ls)->refCount + 1;
    }
    ParseNew(this,(Lexer *)local_b8,SUB81(&local_e0,0),statementStart);
    Lexer::release(&local_e0);
    aVar6 = extraout_RDX_00;
  }
  VVar7.data.number = aVar6.number;
  VVar7._0_8_ = this;
  return VVar7;
}

Assistant:

Value Parser::ParseUnaryMinus(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseNew;
		if (tokens.Peek().type != Token::Type::OpMinus) return (*this.*nextLevel)(tokens, asLval, statementStart);
		tokens.Dequeue();		// skip '-'

		AllowLineBreak(tokens); // allow a line break after a unary operator
		
		Value val = (*this.*nextLevel)(tokens, false, false);
		if (val.type == ValueType::Number) {
			// If what follows is a numeric literal, just invert it and be done!
			val.data.number = -val.data.number;
			return val;
		}
		// Otherwise, subtract it from 0 and return a new temporary.
		int tempNum = output->nextTempNum++;
		output->Add(TACLine(Value::Temp(tempNum), TACLine::Op::AMinusB, Value::zero, val));
		return Value::Temp(tempNum);
	}